

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O0

void deqp::gles2::Functional::validRboAttachmentsTest(TestContext *testCtx,Context *context)

{
  int local_20;
  int pointNdx;
  deUint32 rbo;
  Context *context_local;
  TestContext *testCtx_local;
  
  (*context->_vptr_Context[9])(context,0x8d40,1);
  (*context->_vptr_Context[0xc])(context,0x8d41,3);
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    (*context->_vptr_Context[0x20])
              (context,0x8d40,(ulong)validRboAttachmentsTest::attachmentPoints[local_20],0x8d41,3);
    checkError(testCtx,context,0);
  }
  return;
}

Assistant:

static void validRboAttachmentsTest (tcu::TestContext& testCtx, sglr::Context& context)
{
	static const GLenum attachmentPoints[] =
	{
		GL_COLOR_ATTACHMENT0,
		GL_DEPTH_ATTACHMENT,
		GL_STENCIL_ATTACHMENT
	};

	context.bindFramebuffer(GL_FRAMEBUFFER, 1);

	// Renderbuffer
	deUint32 rbo = 3;
	context.bindRenderbuffer(GL_RENDERBUFFER, rbo);
	for (int pointNdx = 0; pointNdx < DE_LENGTH_OF_ARRAY(attachmentPoints); pointNdx++)
	{
		context.framebufferRenderbuffer(GL_FRAMEBUFFER, attachmentPoints[pointNdx], GL_RENDERBUFFER, rbo);
		checkError(testCtx, context, GL_NO_ERROR);
	}
}